

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<void_()>::UntypedPerformAction
          (FunctionMockerBase<void_()> *this,void *untyped_action,void *untyped_args)

{
  UntypedActionResultHolderBase *pUVar1;
  ArgumentTuple *args;
  Action<void_()> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMockerBase<void_()> *this_local;
  
  action.impl_.link_.next_ = (linked_ptr_internal *)untyped_args;
  Action<void_()>::Action((Action<void_()> *)&args,(Action<void_()> *)untyped_action);
  pUVar1 = &ActionResultHolder<void>::PerformAction<void()>
                      ((Action<void_()> *)&args,(ArgumentTuple *)action.impl_.link_.next_)->
            super_UntypedActionResultHolderBase;
  Action<void_()>::~Action((Action<void_()> *)&args);
  return pUVar1;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }